

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

Promise<void> __thiscall
capnproto_test::capnp::test::TestCallOrder::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  CallContext<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  CVar1;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  PromiseNode *extraout_RDX;
  undefined6 in_register_00000032;
  long *plVar3;
  Promise<void> PVar4;
  uint16_t methodId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  PromiseNode *pPVar2;
  
  plVar3 = (long *)CONCAT62(in_register_00000032,methodId);
  if ((short)context.hook == 0) {
    CVar1 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                      ((Server *)((long)plVar3 + *(long *)(*plVar3 + -0x18)),in_RCX);
    (**(code **)(*plVar3 + 8))(this,plVar3,CVar1.hook);
    pPVar2 = extraout_RDX;
  }
  else {
    PVar4 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,(char *)((long)plVar3 + *(long *)(*plVar3 + -0x18)),0x507aee,
                       0x51);
    pPVar2 = PVar4.super_PromiseBase.node.ptr;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar2;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> TestCallOrder::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return getCallSequence(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,  ::capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>(context));
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestCallOrder",
          0xa0e77035bdff0051ull, methodId);
  }
}